

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::TestTexture::populateCompressedLevels
          (TestTexture *this,CompressedTexFormat format,
          vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          *decompressedLevels)

{
  pointer *pppCVar1;
  deUint8 *dst;
  iterator __position;
  CompressedTexFormat format_00;
  bool bVar2;
  deUint32 dVar3;
  pointer pPVar4;
  CompressedTexture *this_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  CompressedTexture *compressedLevel;
  PixelBufferAccess level;
  Random random;
  CompressedTexture *local_90;
  CompressedTexFormat local_88;
  TexDecompressionParams local_84;
  vector<tcu::CompressedTexture*,std::allocator<tcu::CompressedTexture*>> *local_80;
  TestTexture *local_78;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_70;
  PixelBufferAccess local_68;
  deRandom local_40;
  
  local_88 = format;
  deRandom_init(&local_40,0x7b);
  format_00 = local_88;
  pPVar4 = (decompressedLevels->
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((decompressedLevels->
      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    local_80 = (vector<tcu::CompressedTexture*,std::allocator<tcu::CompressedTexture*>> *)
               &this->m_compressedLevels;
    lVar9 = 0;
    uVar7 = 0;
    local_78 = this;
    local_70 = decompressedLevels;
    do {
      local_68.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar4 + uVar7);
      lVar6 = 2;
      do {
        local_68.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] =
             *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar6 * 4 + lVar9 + -8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      lVar6 = 5;
      do {
        local_68.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] =
             *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar6 * 4 + lVar9 + -8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      local_68.super_ConstPixelBufferAccess.m_data =
           *(void **)((TextureFormat *)(pPVar4 + uVar7) + 4);
      this_00 = (CompressedTexture *)operator_new(0x28);
      tcu::CompressedTexture::CompressedTexture
                (this_00,format_00,local_68.super_ConstPixelBufferAccess.m_size.m_data[0],
                 local_68.super_ConstPixelBufferAccess.m_size.m_data[1],
                 local_68.super_ConstPixelBufferAccess.m_size.m_data[2]);
      dst = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
      local_90 = this_00;
      bVar2 = tcu::isAstcFormat(format_00);
      if (bVar2) {
        iVar8 = *(int *)&(local_90->m_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(local_90->m_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        dVar3 = deRandom_getUint32(&local_40);
        iVar5 = iVar8 + 0xf;
        if (-1 < iVar8) {
          iVar5 = iVar8;
        }
        tcu::astc::generateRandomValidBlocks(dst,(long)(iVar5 >> 4),local_88,ASTCMODE_LDR,dVar3);
      }
      else if ((format_00 != COMPRESSEDTEXFORMAT_ETC1_RGB8) &&
              (0 < *(int *)&(local_90->m_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(local_90->m_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
        lVar6 = 0;
        do {
          dVar3 = deRandom_getUint32(&local_40);
          dst[lVar6] = (deUint8)dVar3;
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)&(local_90->m_data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(local_90->m_data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      __position._M_current =
           (local_78->m_compressedLevels).
           super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_78->m_compressedLevels).
          super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<tcu::CompressedTexture*,std::allocator<tcu::CompressedTexture*>>::
        _M_realloc_insert<tcu::CompressedTexture*const&>(local_80,__position,&local_90);
      }
      else {
        *__position._M_current = local_90;
        pppCVar1 = &(local_78->m_compressedLevels).
                    super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      local_84.astcMode = ASTCMODE_LDR;
      tcu::CompressedTexture::decompress(local_90,&local_68,&local_84);
      uVar7 = uVar7 + 1;
      pPVar4 = (local_70->
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x28;
    } while (uVar7 < (ulong)(((long)(local_70->
                                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void TestTexture::populateCompressedLevels (tcu::CompressedTexFormat format, const std::vector<tcu::PixelBufferAccess>& decompressedLevels)
{
	// Generate random compressed data and update decompressed data

	de::Random random(123);

	for (size_t levelNdx = 0; levelNdx < decompressedLevels.size(); levelNdx++)
	{
		const tcu::PixelBufferAccess	level				= decompressedLevels[levelNdx];
		tcu::CompressedTexture*			compressedLevel		= new tcu::CompressedTexture(format, level.getWidth(), level.getHeight(), level.getDepth());
		deUint8* const					compressedData		= (deUint8*)compressedLevel->getData();

		if (tcu::isAstcFormat(format))
		{
			// \todo [2016-01-20 pyry] Comparison doesn't currently handle invalid blocks correctly so we use only valid blocks
			tcu::astc::generateRandomValidBlocks(compressedData, compressedLevel->getDataSize()/tcu::astc::BLOCK_SIZE_BYTES,
												 format, tcu::TexDecompressionParams::ASTCMODE_LDR, random.getUint32());
		}
		else
		{
			// Generate random compressed data
			// Random initial values cause assertion during the decompression in case of COMPRESSEDTEXFORMAT_ETC1_RGB8 format
			if (format != tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8)
				for (int byteNdx = 0; byteNdx < compressedLevel->getDataSize(); byteNdx++)
					compressedData[byteNdx] = 0xFF & random.getUint32();
		}

		m_compressedLevels.push_back(compressedLevel);

		// Store decompressed data
		compressedLevel->decompress(level, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));
	}
}